

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetItem
               (Var receiver,RecyclableObject *object,uint32 index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags,
               BOOL skipPrototypeCheck)

{
  ImplicitCallFlags *pIVar1;
  code *pcVar2;
  PropertyRecord *aValue;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptProxy *this;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  ScriptContext *local_48;
  DescriptorFlags local_3c;
  Var pvStack_38;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  
  pvStack_38 = (Var)0x0;
  local_3c = None;
  propertyRecord = (PropertyRecord *)receiver;
  bVar3 = VarIs<Js::RecyclableObject>(receiver);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    local_48 = scriptContext;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xd95,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar3) goto LAB_00aba3b9;
    *puVar6 = 0;
    scriptContext = local_48;
  }
  BVar4 = CheckPrototypesForAccessorOrNonWritableItem
                    (object,index,&stack0xffffffffffffffc8,&local_3c,scriptContext,
                     skipPrototypeCheck);
  aValue = propertyRecord;
  if (BVar4 == 0) {
    BVar4 = IsObject(propertyRecord);
    if (BVar4 != 0) {
      pRVar7 = VarTo<Js::RecyclableObject>(aValue);
      iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x29])
                        (pRVar7,(ulong)index,value,(ScriptContext *)(ulong)propertyOperationFlags);
      return iVar5;
    }
  }
  else {
    pIVar1 = &scriptContext->threadContext->implicitCallFlags;
    *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
    if ((local_3c & Accessor) != None) {
      bVar3 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                        (propertyOperationFlags,pvStack_38,scriptContext);
      if (bVar3) {
        return 1;
      }
      bVar3 = JavascriptError::ThrowIfNotExtensibleUndefinedSetter
                        (propertyOperationFlags,pvStack_38,scriptContext);
      if (bVar3) {
        return 1;
      }
      if (pvStack_38 == (Var)0x0) {
        return 1;
      }
      pRVar7 = VarTo<Js::RecyclableObject>(pvStack_38);
      CallSetter(pRVar7,propertyRecord,value,scriptContext);
      return 1;
    }
    if ((local_3c & Proxy) != None) {
      local_48 = (ScriptContext *)(ulong)propertyOperationFlags;
      bVar3 = VarIs<Js::JavascriptProxy>(pvStack_38);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xda9,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                    "VarIs<JavascriptProxy>(setterValueOrProxy)");
        if (!bVar3) goto LAB_00aba3b9;
        *puVar6 = 0;
      }
      this = VarTo<Js::JavascriptProxy>(pvStack_38);
      local_58 = (PropertyRecord *)0x0;
      JavascriptProxy::PropertyIdFromInt(this,index,&local_58);
      BVar4 = JavascriptProxy::SetPropertyTrap
                        (this,propertyRecord,SetItemKind,local_58->pid,value,scriptContext,
                         (PropertyOperationFlags)local_48,skipPrototypeCheck);
      return BVar4;
    }
    if ((local_3c & WritableData) != Data) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xdb1,"((flags & Data) == Data && (flags & Writable) == None)",
                                  "(flags & Data) == Data && (flags & Writable) == None");
      if (!bVar3) {
LAB_00aba3b9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    if ((propertyOperationFlags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None)
    {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec4a,(PCWSTR)0x0);
    }
    JavascriptError::ThrowCantAssign(propertyOperationFlags,scriptContext,index);
  }
  JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,scriptContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetItem(Var receiver, RecyclableObject* object, uint32 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags, BOOL skipPrototypeCheck /* = FALSE */)
    {
        Var setterValueOrProxy = nullptr;
        DescriptorFlags flags = None;
        Assert(!TaggedNumber::Is(receiver));
        if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(object, index, &setterValueOrProxy, &flags, scriptContext, skipPrototypeCheck))
        {
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
            if ((flags & Accessor) == Accessor)
            {
                if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, scriptContext) ||
                    JavascriptError::ThrowIfNotExtensibleUndefinedSetter(propertyOperationFlags, setterValueOrProxy, scriptContext))
                {
                    return TRUE;
                }
                if (setterValueOrProxy)
                {
                    RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                    JavascriptOperators::CallSetter(func, receiver, value, scriptContext);
                }
                return TRUE;
            }
            else if ((flags & Proxy) == Proxy)
            {
                Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                const PropertyRecord* propertyRecord = nullptr;
                proxy->PropertyIdFromInt(index, &propertyRecord);
                return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetItemKind, propertyRecord->GetPropertyId(), value, scriptContext, propertyOperationFlags, skipPrototypeCheck);
            }
            else
            {
                Assert((flags & Data) == Data && (flags & Writable) == None);
                if ((propertyOperationFlags & PropertyOperationFlags::PropertyOperation_ThrowIfNotExtensible) == PropertyOperationFlags::PropertyOperation_ThrowIfNotExtensible)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
                }

                JavascriptError::ThrowCantAssign(propertyOperationFlags, scriptContext, index);
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
                return FALSE;
            }
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
            return FALSE;
        }

        return (VarTo<RecyclableObject>(receiver))->SetItem(index, value, propertyOperationFlags);
    }